

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

void __thiscall bitio::bitio_stream::skip(bitio_stream *this,uint64_t n)

{
  undefined8 local_18;
  uint64_t n_local;
  bitio_stream *this_local;
  
  local_18 = n;
  while (local_18 != 0) {
    if (local_18 < 0x41) {
      lim_skip(this,(uint8_t)local_18);
      local_18 = 0;
    }
    else {
      lim_skip(this,'@');
      local_18 = local_18 - 0x40;
    }
  }
  return;
}

Assistant:

void bitio_stream::skip(uint64_t n) {
    while (n > 0) {
        if (n > 0x40) {
            lim_skip(0x40);
            n -= 0x40;
        } else {
            lim_skip(n);
            n = 0;
        }
    }
}